

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall
wasm::PrintSExpression::printDebugDelimiterLocation(PrintSExpression *this,Expression *curr,Index i)

{
  Function *pFVar1;
  ulong uVar2;
  ostream *poVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pFVar1 = this->currFunction;
  if ((pFVar1 != (Function *)0x0) && (this->debugInfo == true)) {
    uVar2 = (pFVar1->delimiterLocations)._M_h._M_bucket_count;
    uVar4 = (ulong)curr % uVar2;
    p_Var5 = (pFVar1->delimiterLocations)._M_h._M_buckets[uVar4];
    p_Var6 = (__node_base_ptr)0x0;
    if ((p_Var5 != (__node_base_ptr)0x0) &&
       (p_Var7 = p_Var5->_M_nxt, p_Var6 = p_Var5, (Expression *)p_Var5->_M_nxt[1]._M_nxt != curr)) {
      while (p_Var5 = p_Var7, p_Var7 = p_Var5->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
        p_Var6 = (__node_base_ptr)0x0;
        if (((ulong)p_Var7[1]._M_nxt % uVar2 != uVar4) ||
           (p_Var6 = p_Var5, (Expression *)p_Var7[1]._M_nxt == curr)) goto LAB_00855d3c;
      }
      p_Var6 = (__node_base_ptr)0x0;
    }
LAB_00855d3c:
    if (p_Var6 == (__node_base_ptr)0x0) {
      p_Var7 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var7 = p_Var6->_M_nxt;
    }
    if (p_Var7 != (_Hash_node_base *)0x0) {
      Colors::outputColorCode(this->o,"\x1b[37m");
      poVar3 = this->o;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";; code offset: 0x",0x12);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
      ZeroInitSmallVector<unsigned_int,_1UL>::operator[]
                ((ZeroInitSmallVector<unsigned_int,_1UL> *)(p_Var7 + 2),(ulong)i);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
           *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 2;
      local_48 = (long *)CONCAT71(local_48._1_7_,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_48,1);
      Colors::outputColorCode(this->o,"\x1b[0m");
      poVar3 = this->o;
      local_48 = local_38;
      std::__cxx11::string::_M_construct((ulong)&local_48,(char)this->indent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_48,local_40);
      if (local_48 != local_38) {
        operator_delete(local_48,local_38[0] + 1);
      }
    }
  }
  return;
}

Assistant:

void printDebugDelimiterLocation(Expression* curr, Index i) {
    if (currFunction && debugInfo) {
      auto iter = currFunction->delimiterLocations.find(curr);
      if (iter != currFunction->delimiterLocations.end()) {
        auto& locations = iter->second;
        Colors::grey(o);
        o << ";; code offset: 0x" << std::hex << locations[i] << std::dec
          << '\n';
        restoreNormalColor(o);
        doIndent(o, indent);
      }
    }
  }